

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

String * __thiscall
capnp::TextCodec::encode(String *__return_storage_ptr__,TextCodec *this,Reader *value)

{
  Reader value_00;
  Reader value_01;
  Type TVar1;
  Reader *params;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  ReaderFor<capnp::DynamicList> local_118;
  StringTree local_d8;
  ReaderFor<capnp::DynamicStruct> local_90;
  StringTree local_58;
  Reader *local_20;
  Reader *value_local;
  TextCodec *this_local;
  
  local_20 = value;
  value_local = (Reader *)this;
  this_local = (TextCodec *)__return_storage_ptr__;
  if ((this->prettyPrint & 1U) == 0) {
    kj::str<capnp::DynamicValue::Reader&>(__return_storage_ptr__,(kj *)value,value);
  }
  else {
    TVar1 = DynamicValue::Reader::getType(value);
    if (TVar1 == STRUCT) {
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_90,value);
      value_00.reader.segment = (SegmentReader *)local_90.reader.capTable;
      value_00.schema.super_Schema.raw = (Schema)(Schema)local_90.reader.segment;
      value_00.reader.capTable = (CapTableReader *)local_90.reader.data;
      value_00.reader.data = local_90.reader.pointers;
      value_00.reader.pointers = (WirePointer *)local_90.reader._32_8_;
      value_00.reader.dataSize = local_90.reader.nestingLimit;
      value_00.reader.pointerCount = local_90.reader._44_2_;
      value_00.reader._38_2_ = local_90.reader._46_2_;
      value_00.reader._40_8_ = in_stack_fffffffffffffeb0;
      prettyPrint(value_00);
      kj::StringTree::flatten(__return_storage_ptr__,&local_58);
      kj::StringTree::~StringTree(&local_58);
    }
    else {
      TVar1 = DynamicValue::Reader::getType(value);
      if (TVar1 == LIST) {
        DynamicValue::Reader::as<capnp::DynamicList>(&local_118,value);
        value_01.schema.elementType.field_4 =
             (anon_union_8_2_eba6ea51_for_Type_5)local_118.reader.segment;
        value_01.schema.elementType._0_8_ = local_118.schema.elementType.field_4.schema;
        value_01.reader.segment = (SegmentReader *)local_118.reader.capTable;
        value_01.reader.capTable = (CapTableReader *)local_118.reader.ptr;
        value_01.reader.ptr = (byte *)local_118.reader._24_8_;
        value_01.reader._24_8_ = local_118.reader._32_8_;
        value_01.reader.structDataSize = local_118.reader.nestingLimit;
        value_01.reader.structPointerCount = local_118.reader._44_2_;
        value_01.reader.elementSize = local_118.reader._46_1_;
        value_01.reader._39_1_ = local_118.reader._47_1_;
        value_01.reader._40_8_ = in_stack_fffffffffffffeb8;
        prettyPrint(value_01);
        kj::StringTree::flatten(__return_storage_ptr__,&local_d8);
        kj::StringTree::~StringTree(&local_d8);
      }
      else {
        kj::str<capnp::DynamicValue::Reader&>(__return_storage_ptr__,(kj *)value,params);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String TextCodec::encode(DynamicValue::Reader value) const {
  if (!prettyPrint) {
    return kj::str(value);
  } else {
    if (value.getType() == DynamicValue::Type::STRUCT) {
      return capnp::prettyPrint(value.as<DynamicStruct>()).flatten();
    } else if (value.getType() == DynamicValue::Type::LIST) {
      return capnp::prettyPrint(value.as<DynamicList>()).flatten();
    } else {
      return kj::str(value);
    }
  }
}